

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
spirv_cross::Compiler::AnalyzeVariableScopeAccessHandler::id_is_phi_variable
          (AnalyzeVariableScopeAccessHandler *this,uint32_t id)

{
  uint32_t uVar1;
  SPIRVariable *pSVar2;
  byte local_39;
  SPIRVariable *var;
  uint32_t id_local;
  AnalyzeVariableScopeAccessHandler *this_local;
  
  uVar1 = get_current_id_bound(this->compiler);
  if (id < uVar1) {
    pSVar2 = maybe_get<spirv_cross::SPIRVariable>(this->compiler,id);
    local_39 = 0;
    if (pSVar2 != (SPIRVariable *)0x0) {
      local_39 = pSVar2->phi_variable;
    }
    this_local._7_1_ = (bool)(local_39 & 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Compiler::AnalyzeVariableScopeAccessHandler::id_is_phi_variable(uint32_t id) const
{
	if (id >= compiler.get_current_id_bound())
		return false;
	auto *var = compiler.maybe_get<SPIRVariable>(id);
	return var && var->phi_variable;
}